

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void addinfo(lua_State *L,char *msg)

{
  CallInfo *ci_00;
  long lVar1;
  uint uVar2;
  TString *src;
  char local_68 [4];
  int line;
  char buff [60];
  CallInfo *ci;
  char *msg_local;
  lua_State *L_local;
  
  ci_00 = L->ci;
  if ((ci_00->callstatus & 1) != 0) {
    uVar2 = currentline(ci_00);
    lVar1 = *(long *)(*(long *)((ci_00->func->value_).f + 0x18) + 0x48);
    if (lVar1 == 0) {
      local_68[0] = '?';
      local_68[1] = 0;
    }
    else {
      luaO_chunkid(local_68,(char *)(lVar1 + 0x18),0x3c);
    }
    luaO_pushfstring(L,"%s:%d: %s",local_68,(ulong)uVar2,msg);
  }
  return;
}

Assistant:

static void addinfo (lua_State *L, const char *msg) {
  CallInfo *ci = L->ci;
  if (isLua(ci)) {  /* is Lua code? */
    char buff[LUA_IDSIZE];  /* add file:line information */
    int line = currentline(ci);
    TString *src = ci_func(ci)->p->source;
    if (src)
      luaO_chunkid(buff, getstr(src), LUA_IDSIZE);
    else {  /* no source available; use "?" instead */
      buff[0] = '?'; buff[1] = '\0';
    }
    luaO_pushfstring(L, "%s:%d: %s", buff, line, msg);
  }
}